

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaCheckCVCWildcardNamespace(xmlSchemaWildcardPtr wild,xmlChar *ns)

{
  int iVar1;
  xmlSchemaWildcardNsPtr cur;
  xmlSchemaWildcardNsPtr pxVar2;
  
  if (wild == (xmlSchemaWildcardPtr)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if (wild->any == 0) {
      pxVar2 = wild->nsSet;
      if (pxVar2 == (xmlSchemaWildcardNsPtr)0x0) {
        if ((ns != (xmlChar *)0x0 && wild->negNsSet != (xmlSchemaWildcardNsPtr)0x0) &&
           (iVar1 = xmlStrEqual(wild->negNsSet->value,ns), iVar1 == 0)) {
          return 0;
        }
      }
      else {
        for (; pxVar2 != (xmlSchemaWildcardNsPtr)0x0; pxVar2 = pxVar2->next) {
          iVar1 = xmlStrEqual(pxVar2->value,ns);
          if (iVar1 != 0) {
            return 0;
          }
        }
      }
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int
xmlSchemaCheckCVCWildcardNamespace(xmlSchemaWildcardPtr wild,
				   const xmlChar* ns)
{
    if (wild == NULL)
	return(-1);

    if (wild->any)
	return(0);
    else if (wild->nsSet != NULL) {
	xmlSchemaWildcardNsPtr cur;

	cur = wild->nsSet;
	while (cur != NULL) {
	    if (xmlStrEqual(cur->value, ns))
		return(0);
	    cur = cur->next;
	}
    } else if ((wild->negNsSet != NULL) && (ns != NULL) &&
	(!xmlStrEqual(wild->negNsSet->value, ns)))
	return(0);

    return(1);
}